

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O3

size_t singleOptionUsage(FILE *fp,columns_t columns,poptOption *opt,char *translation_domain)

{
  uint uVar1;
  char *__s;
  ushort **ppuVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  int __c;
  byte bVar8;
  mbstate_t t;
  char *local_40;
  mbstate_t local_38;
  
  __s = getArgDescrip(opt,(char *)columns);
  ppuVar2 = __ctype_b_loc();
  pcVar6 = opt->longName;
  bVar8 = (*(byte *)((long)*ppuVar2 + (long)opt->shortName * 2 + 1) & 0x40) >> 6 &
          (long)opt->shortName != 0x20;
  if (bVar8 == 0) {
    lVar7 = 3;
    if (pcVar6 == (char *)0x0) {
      return columns->cur;
    }
  }
  else {
    lVar7 = 5;
    if (pcVar6 == (char *)0x0) goto LAB_0010734d;
  }
  uVar1 = opt->argInfo;
  sVar4 = strlen(pcVar6);
  lVar7 = (ulong)(-1 < (int)uVar1) + sVar4 + lVar7 + (ulong)bVar8 + 1;
LAB_0010734d:
  if (__s != (char *)0x0) {
    pvVar3 = memchr(" =(",(int)*__s,4);
    local_40 = __s;
    sVar4 = strlen(__s);
    local_38.__count = 0;
    local_38.__value = (_union_27)0x0;
    sVar4 = mbsrtowcs((wchar_t *)0x0,&local_40,sVar4,&local_38);
    lVar7 = lVar7 + sVar4 + (ulong)(pvVar3 == (void *)0x0);
  }
  if (columns->max < columns->cur + lVar7) {
    fwrite("\n       ",8,1,(FILE *)fp);
    columns->cur = 7;
  }
  fwrite(" [",2,1,(FILE *)fp);
  if (bVar8 != 0) {
    fprintf((FILE *)fp,"-%c",(ulong)(uint)(int)opt->shortName);
  }
  if (opt->longName != (char *)0x0) {
    pcVar6 = "";
    if (bVar8 != 0) {
      pcVar6 = "|";
    }
    pcVar5 = "-";
    if (-1 < (int)opt->argInfo) {
      pcVar5 = "--";
    }
    fprintf((FILE *)fp,"%s%s%s",pcVar6,pcVar5);
  }
  if (__s != (char *)0x0) {
    pvVar3 = memchr(" =(",(int)*__s,4);
    if (pvVar3 == (void *)0x0) {
      __c = 0x3d;
      if (opt->longName == (char *)0x0) {
        __c = 0x20;
      }
      fputc(__c,(FILE *)fp);
    }
    fputs(__s,(FILE *)fp);
  }
  fputc(0x5d,(FILE *)fp);
  return columns->cur + lVar7 + 1;
}

Assistant:

static size_t singleOptionUsage(FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char *translation_domain)
{
    size_t len = sizeof(" []")-1;
    const char * argDescrip = getArgDescrip(opt, translation_domain);
    /* Display shortName iff printable non-space. */
    int prtshort = (int)(isprint((int)opt->shortName) && opt->shortName != ' ');

#define	prtlong	(opt->longName != NULL)	/* XXX splint needs a clue */
    if (!(prtshort || prtlong))
	return columns->cur;

    len = sizeof(" []")-1;
    if (prtshort)
	len += sizeof("-c")-1;
    if (prtlong) {
	if (prtshort) len += sizeof("|")-1;
	len += (F_ISSET(opt, ONEDASH) ? sizeof("-") : sizeof("--")) - 1;
	len += strlen(opt->longName);
    }

    if (argDescrip) {

	/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	if (!strchr(" =(", argDescrip[0])) len += sizeof("=")-1;

	/* Adjust for (possible) wide characters. */
	len += stringDisplayWidth(argDescrip);
    }

    if ((columns->cur + len) > columns->max) {
	fprintf(fp, "\n       ");
	columns->cur = (size_t)7;
    } 

    fprintf(fp, " [");
    if (prtshort)
	fprintf(fp, "-%c", opt->shortName);
    if (prtlong)
	fprintf(fp, "%s%s%s",
		(prtshort ? "|" : ""),
		(F_ISSET(opt, ONEDASH) ? "-" : "--"),
		opt->longName);
#undef	prtlong

    if (argDescrip) {
	/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	if (!strchr(" =(", argDescrip[0])) fputc(opt->longName == NULL ? ' ' : '=', fp);
	fprintf(fp, "%s", argDescrip);
    }
    fprintf(fp, "]");

    return columns->cur + len + 1;
}